

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

iterator * __thiscall
idx2::Delete<unsigned_long,idx2::brick_volume>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::brick_volume> *Ht,unsigned_long *Key)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = (byte)*(undefined8 *)(this + 0x20);
  uVar3 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >> (-bVar2 & 0x3f);
  lVar1 = *(long *)this;
  uVar4 = uVar3;
  do {
    if (*(char *)(*(long *)(this + 0x10) + uVar4) == '\0') break;
    if (*(unsigned_long **)(lVar1 + uVar4 * 8) == Ht->Keys) {
      *(undefined1 *)(*(long *)(this + 0x10) + uVar4) = 1;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -1;
      goto LAB_0017bdb8;
    }
    uVar4 = uVar4 + 1 & ~(-1L << (bVar2 & 0x3f));
  } while (uVar4 != uVar3);
  uVar4 = 1L << (bVar2 & 0x3f);
LAB_0017bdb8:
  __return_storage_ptr__->Key = (unsigned_long *)(lVar1 + uVar4 * 8);
  __return_storage_ptr__->Val = (brick_volume *)(uVar4 * 0x40 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)this;
  __return_storage_ptr__->Idx = uVar4;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Delete(hash_table<k, v>* Ht, const k& Key)
{
  i64 H = Index(*Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht->Stats[H] != hash_table<k, v>::Empty)
  {
    if (Ht->Keys[H] == Key)
    {
      Ht->Stats[H] = hash_table<k, v>::Tombstone;
      --Ht->Size;
      idx2_Assert(Ht->Size >= 0);
      Found = true;
      return IterAt(*Ht, H);
    }
    ++H;
    if ((H &= Capacity(*Ht) - 1) == Start)
      break;
  }
  if (Found)
  {
    idx2_Assert(Ht->Keys[H] == Key);
  }
  idx2_Assert(Found);
  return End(*Ht);
}